

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetime.cpp
# Opt level: O0

BOOL FileTimeToDosDateTime(FILETIME *lpFileTime,LPWORD lpFatDate,LPWORD lpFatTime)

{
  BOOL BVar1;
  undefined1 local_34 [8];
  SYSTEMTIME SysTime;
  BOOL bRetVal;
  LPWORD lpFatTime_local;
  LPWORD lpFatDate_local;
  FILETIME *lpFileTime_local;
  
  SysTime.wHour = 0;
  SysTime.wMinute = 0;
  unique0x10000138 = lpFatTime;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  if (((lpFileTime == (FILETIME *)0x0) || (lpFatDate == (LPWORD)0x0)) || (lpFatTime == (LPWORD)0x0))
  {
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
    SetLastError(0x57);
  }
  else {
    BVar1 = FileTimeToSystemTime(lpFileTime,(LPSYSTEMTIME)local_34);
    if (BVar1 == 0) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0x57);
      SysTime.wHour = 0;
      SysTime.wMinute = 0;
    }
    else if (((ushort)local_34._0_2_ < 0x7bc) || (0x7f5 < (ushort)local_34._0_2_)) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      SetLastError(0x57);
    }
    else {
      *lpFatDate = 0;
      *stack0xffffffffffffffe0 = 0;
      *lpFatDate = *lpFatDate | local_34._6_2_ & 0x1f;
      *lpFatDate = *lpFatDate | (local_34._2_2_ & 0xf) << 5;
      *lpFatDate = *lpFatDate | (local_34._0_2_ - 0x7bc) * 0x200;
      if ((uint)SysTime.wDayOfWeek % 2 == 0) {
        *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 | SysTime.wDayOfWeek / 2 & 0x1f;
      }
      else {
        *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 | SysTime.wDayOfWeek / 2 + 1 & 0x1f;
      }
      *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 | (SysTime.wMonth & 0x3f) << 5;
      *stack0xffffffffffffffe0 = *stack0xffffffffffffffe0 | SysTime.wYear << 0xb;
      SysTime.wHour = 1;
      SysTime.wMinute = 0;
    }
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    BVar1._0_2_ = SysTime.wHour;
    BVar1._2_2_ = SysTime.wMinute;
    return BVar1;
  }
  abort();
}

Assistant:

BOOL
PALAPI
FileTimeToDosDateTime(
            IN CONST FILETIME *lpFileTime,
            OUT LPWORD lpFatDate,
            OUT LPWORD lpFatTime )
{
    BOOL bRetVal = FALSE;

    PERF_ENTRY(FileTimeToDosDateTime);
    ENTRY( "FileTimeToDosDateTime( lpFileTime=%p, lpFatDate=%p, lpFatTime=%p )\n",
           lpFileTime, lpFatDate, lpFatTime );

    /* Sanity checks. */
    if ( !lpFileTime || !lpFatDate || !lpFatTime )
    {
        ERROR( "Incorrect parameters.\n" );
        SetLastError( ERROR_INVALID_PARAMETER );
    }
    else
    {
        /* Do conversion. */
        SYSTEMTIME SysTime;
        if ( FileTimeToSystemTime( lpFileTime, &SysTime ) )
        {
            if ( SysTime.wYear >= 1980 && SysTime.wYear <= 2037 )
            {
                *lpFatDate = 0;
                *lpFatTime = 0;

                *lpFatDate |= ( SysTime.wDay & 0x1F );
                *lpFatDate |= ( ( SysTime.wMonth & 0xF ) << 5 );
                *lpFatDate |= ( ( ( SysTime.wYear - 1980 ) & 0x7F ) << 9 );

                if ( SysTime.wSecond % 2 == 0 )
                {
                    *lpFatTime |= ( ( SysTime.wSecond / 2 )  & 0x1F );
                }
                else
                {
                    *lpFatTime |= ( ( SysTime.wSecond / 2 + 1 )  & 0x1F );
                }

                *lpFatTime |= ( ( SysTime.wMinute & 0x3F ) << 5 );
                *lpFatTime |= ( ( SysTime.wHour & 0x1F ) << 11 );
                
                bRetVal = TRUE;
            }
            else
            {
                ERROR( "The function can only repersent dates between 1/1/1980"
                       " and 12/31/2037\n" );
                SetLastError( ERROR_INVALID_PARAMETER );
            }
        }
        else
        {
            ERROR( "Unable to convert file time to system time.\n" );
            SetLastError( ERROR_INVALID_PARAMETER );
            bRetVal = FALSE;
        }
    }

    LOGEXIT( "returning BOOL %d\n", bRetVal );
    PERF_EXIT(FileTimeToDosDateTime);
    return bRetVal;
}